

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmNinjaTargetGenerator.cxx
# Opt level: O0

string * __thiscall
cmNinjaTargetGenerator::GetTargetDependInfoPath
          (string *__return_storage_ptr__,cmNinjaTargetGenerator *this,string *lang,string *config)

{
  string *str;
  cmGlobalNinjaGenerator *pcVar1;
  char local_dd [13];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  cmAlphaNum local_90;
  cmAlphaNum local_60;
  undefined1 local_29;
  string *local_28;
  string *config_local;
  string *lang_local;
  cmNinjaTargetGenerator *this_local;
  string *path;
  
  local_29 = 0;
  local_28 = config;
  config_local = lang;
  lang_local = (string *)this;
  this_local = (cmNinjaTargetGenerator *)__return_storage_ptr__;
  str = cmMakefile::GetCurrentBinaryDirectory_abi_cxx11_
                  ((this->super_cmCommonTargetGenerator).Makefile);
  cmAlphaNum::cmAlphaNum(&local_60,str);
  cmAlphaNum::cmAlphaNum(&local_90,'/');
  (*(this->LocalGenerator->super_cmLocalCommonGenerator).super_cmLocalGenerator.
    _vptr_cmLocalGenerator[0xe])
            (&local_b0,this->LocalGenerator,(this->super_cmCommonTargetGenerator).GeneratorTarget);
  pcVar1 = GetGlobalGenerator(this);
  (*(pcVar1->super_cmGlobalCommonGenerator).super_cmGlobalGenerator._vptr_cmGlobalGenerator[0x49])
            (&local_d0,pcVar1,local_28);
  local_dd[0] = '/';
  cmStrCat<std::__cxx11::string,std::__cxx11::string,char,std::__cxx11::string,char[16]>
            (__return_storage_ptr__,&local_60,&local_90,&local_b0,&local_d0,local_dd,config_local,
             (char (*) [16])"DependInfo.json");
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::~string((string *)&local_b0);
  return __return_storage_ptr__;
}

Assistant:

std::string cmNinjaTargetGenerator::GetTargetDependInfoPath(
  std::string const& lang, const std::string& config) const
{
  std::string path =
    cmStrCat(this->Makefile->GetCurrentBinaryDirectory(), '/',
             this->LocalGenerator->GetTargetDirectory(this->GeneratorTarget),
             this->GetGlobalGenerator()->ConfigDirectory(config), '/', lang,
             "DependInfo.json");
  return path;
}